

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFx.c
# Opt level: O1

int Fx_ManDivRemoveLits(Vec_Int_t *vCube,Vec_Int_t *vDiv,int fCompl)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  if ((fCompl != 0) && (vDiv->nSize != 4)) {
    __assert_fail("!fCompl || Vec_IntSize(vDiv) == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcFx.c"
                  ,0x29e,"int Fx_ManDivRemoveLits(Vec_Int_t *, Vec_Int_t *, int)");
  }
  if (vDiv->nSize < 1) {
    iVar4 = 0;
  }
  else {
    piVar1 = vDiv->pArray;
    uVar7 = 0;
    iVar4 = 0;
    do {
      if (piVar1[uVar7] < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x12f,"int Abc_Lit2Var(int)");
      }
      uVar8 = (uint)piVar1[uVar7] >> 1;
      iVar9 = vCube->nSize;
      uVar10 = (ulong)iVar9;
      iVar3 = 0;
      if (1 < (long)uVar10) {
        uVar6 = (fCompl != 0 && 1 < uVar7) ^ uVar8;
        piVar2 = vCube->pArray;
        if (piVar2[1] == uVar6) {
          bVar13 = true;
          uVar12 = 1;
          uVar11 = 2;
        }
        else {
          uVar11 = 2;
          do {
            uVar12 = uVar11;
            if (uVar10 == uVar12) goto LAB_002cbcea;
            uVar11 = uVar12 + 1;
          } while (piVar2[uVar12] != uVar6);
          bVar13 = uVar12 < uVar10;
        }
        if (bVar13) {
          if ((int)uVar12 + 1 < iVar9) {
            piVar5 = piVar2 + uVar12;
            do {
              *piVar5 = piVar2[uVar11];
              uVar11 = uVar11 + 1;
              iVar9 = vCube->nSize;
              piVar5 = piVar5 + 1;
            } while ((int)uVar11 < iVar9);
          }
          vCube->nSize = iVar9 + -1;
          iVar3 = 1;
        }
      }
LAB_002cbcea:
      iVar4 = iVar3 + iVar4;
      if (vDiv->nSize == 2) {
        iVar9 = vCube->nSize;
        uVar10 = (ulong)iVar9;
        iVar3 = 0;
        if (1 < (long)uVar10) {
          piVar2 = vCube->pArray;
          if ((piVar2[1] ^ uVar8) == 1) {
            bVar13 = true;
            uVar12 = 1;
            uVar11 = 2;
          }
          else {
            uVar11 = 2;
            do {
              uVar12 = uVar11;
              if (uVar10 == uVar12) goto LAB_002cbd7d;
              uVar11 = uVar12 + 1;
            } while ((piVar2[uVar12] ^ uVar8) != 1);
            bVar13 = uVar12 < uVar10;
          }
          if (bVar13) {
            if ((int)uVar12 + 1 < iVar9) {
              piVar5 = piVar2 + uVar12;
              do {
                *piVar5 = piVar2[uVar11];
                uVar11 = uVar11 + 1;
                iVar9 = vCube->nSize;
                piVar5 = piVar5 + 1;
              } while ((int)uVar11 < iVar9);
            }
            vCube->nSize = iVar9 + -1;
            iVar3 = 1;
          }
        }
LAB_002cbd7d:
        iVar4 = iVar4 + iVar3;
      }
      uVar7 = uVar7 + 1;
    } while ((long)uVar7 < (long)vDiv->nSize);
  }
  return iVar4;
}

Assistant:

static inline int Fx_ManDivRemoveLits( Vec_Int_t * vCube, Vec_Int_t * vDiv, int fCompl )
{
    int i, Lit, Count = 0;
    assert( !fCompl || Vec_IntSize(vDiv) == 4 );
    Vec_IntForEachEntry( vDiv, Lit, i )
    {
        Count += Vec_IntRemove1( vCube, Abc_Lit2Var(Lit) ^ (fCompl && i > 1) );  // the last two lits can be complemented
        if ( Vec_IntSize( vDiv ) == 2 )
            Count += Vec_IntRemove1( vCube, Abc_LitNot( Abc_Lit2Var(Lit) ) );
    }
    return Count;
}